

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O1

void __thiscall
irr::video::COpenGLDriver::setFog
          (COpenGLDriver *this,SColor c,E_FOG_TYPE fogType,f32 start,f32 end,f32 density,
          bool pixelFog,bool rangeFog)

{
  undefined8 uVar1;
  float fVar2;
  GLfloat data [4];
  
  if (fogType == EFT_FOG_LINEAR) {
    fVar2 = 9729.0;
  }
  else {
    fVar2 = (float)(int)(0x801 - (uint)(fogType == EFT_FOG_EXP));
  }
  CNullDriver::setFog(&this->super_CNullDriver,c,fogType,start,end,density,pixelFog,rangeFog);
  glFogf(fVar2,0xb65);
  if (this->field_0x5b8 == '\x01') {
    glFogi(0x8450,0x8452);
  }
  if (this->field_0x62b == '\x01') {
    glFogi(0x855a,0x855c - (uint)rangeFog);
  }
  if (fogType == EFT_FOG_LINEAR) {
    glFogf(start,0xb63);
    uVar1 = 0xb64;
  }
  else {
    uVar1 = 0xb62;
    end = density;
  }
  glFogf(end,uVar1);
  glHint(0xc54,pixelFog + 0x1101);
  glFogfv(0xb66);
  return;
}

Assistant:

void COpenGLDriver::setFog(SColor c, E_FOG_TYPE fogType, f32 start,
		f32 end, f32 density, bool pixelFog, bool rangeFog)
{
	CNullDriver::setFog(c, fogType, start, end, density, pixelFog, rangeFog);

	glFogf(GL_FOG_MODE, GLfloat((fogType == EFT_FOG_LINEAR) ? GL_LINEAR : (fogType == EFT_FOG_EXP) ? GL_EXP
																								   : GL_EXP2));

#ifdef GL_EXT_fog_coord
	if (FeatureAvailable[IRR_EXT_fog_coord])
		glFogi(GL_FOG_COORDINATE_SOURCE, GL_FRAGMENT_DEPTH);
#endif
#ifdef GL_NV_fog_distance
	if (FeatureAvailable[IRR_NV_fog_distance]) {
		if (rangeFog)
			glFogi(GL_FOG_DISTANCE_MODE_NV, GL_EYE_RADIAL_NV);
		else
			glFogi(GL_FOG_DISTANCE_MODE_NV, GL_EYE_PLANE_ABSOLUTE_NV);
	}
#endif

	if (fogType == EFT_FOG_LINEAR) {
		glFogf(GL_FOG_START, start);
		glFogf(GL_FOG_END, end);
	} else
		glFogf(GL_FOG_DENSITY, density);

	if (pixelFog)
		glHint(GL_FOG_HINT, GL_NICEST);
	else
		glHint(GL_FOG_HINT, GL_FASTEST);

	SColorf color(c);
	GLfloat data[4] = {color.r, color.g, color.b, color.a};
	glFogfv(GL_FOG_COLOR, data);
}